

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void linklist_remove_node(cache *Cache,record *record)

{
  int iVar1;
  record *prVar2;
  
  if (0 < record->next) {
    prVar2 = Cache->records;
    iVar1 = record->last;
    prVar2[iVar1].next = record->next;
    prVar2[record->next].last = iVar1;
    return;
  }
  iVar1 = record->last;
  Cache->last = iVar1;
  Cache->records[iVar1].next = -1;
  return;
}

Assistant:

static inline void linklist_remove_node(cache* Cache,
                                        struct record *record) {
  if (record->next > 0) {
    //不能保证后面一定有
    Cache->records[record->last].next = record->next;
    Cache->records[record->next].last = record->last;
  } else {
    Cache->last = record->last;
    Cache->records[record->last].next = -1;
  }
}